

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_stats.c
# Opt level: O2

void cram_stats_dump(cram_stats *st)

{
  kh_m_i2i_t *pkVar1;
  byte bVar2;
  khint_t k;
  uint uVar3;
  ulong uVar4;
  
  fwrite("cram_stats:\n",0xc,1,_stderr);
  for (uVar4 = 0; uVar4 != 0x400; uVar4 = uVar4 + 1) {
    if (st->freqs[uVar4] != 0) {
      fprintf(_stderr,"\t%d\t%d\n",uVar4 & 0xffffffff);
    }
  }
  pkVar1 = st->h;
  if (pkVar1 != (kh_m_i2i_t *)0x0) {
    bVar2 = 0;
    for (uVar3 = 0; uVar3 != pkVar1->n_buckets; uVar3 = uVar3 + 1) {
      if ((pkVar1->flags[uVar3 >> 4] >> (bVar2 & 0x1e) & 3) == 0) {
        fprintf(_stderr,"\t%d\t%d\n",(ulong)pkVar1->keys[uVar3],(ulong)(uint)pkVar1->vals[uVar3]);
        pkVar1 = st->h;
      }
      bVar2 = bVar2 + 2;
    }
  }
  return;
}

Assistant:

void cram_stats_dump(cram_stats *st) {
    int i;
    fprintf(stderr, "cram_stats:\n");
    for (i = 0; i < MAX_STAT_VAL; i++) {
	if (!st->freqs[i])
	    continue;
	fprintf(stderr, "\t%d\t%d\n", i, st->freqs[i]);
    }
    if (st->h) {
	khint_t k;
	for (k = kh_begin(st->h); k != kh_end(st->h); k++) {
	    if (!kh_exist(st->h, k))
		continue;

	    fprintf(stderr, "\t%d\t%d\n", kh_key(st->h, k), kh_val(st->h, k));
	}
    }
}